

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

int jacobi_symbol(int q,int p)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  int local_d8 [2];
  int factor [20];
  int power [20];
  int local_30;
  int local_2c;
  int nleft;
  int nfactor;
  
  if (p < 2) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_SYMBOL - Fatal error!\n");
    pcVar3 = "  P must be greater than 1.\n";
  }
  else {
    i4_factor(p,0x14,&local_2c,local_d8,factor + 0x12,&local_30);
    if (local_30 == 1) {
      iVar1 = 0;
      if (0 < q) {
        iVar1 = q;
      }
      if ((long)local_2c < 1) {
        iVar4 = 1;
      }
      else {
        iVar4 = 1;
        lVar5 = 0;
        do {
          iVar2 = legendre_symbol(((uint)((iVar1 + (q >> 0x1f)) - q) / (p + (uint)(p == 0)) -
                                  (q >> 0x1f)) * p + q,local_d8[lVar5]);
          dVar6 = pow((double)iVar2,(double)factor[lVar5 + 0x12]);
          iVar4 = iVar4 * (int)dVar6;
          lVar5 = lVar5 + 1;
        } while (local_2c != lVar5);
      }
      return iVar4;
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"JACOBI_SYMBOL - Fatal error!\n");
    pcVar3 = "  Not enough factorization space.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar3);
  exit(1);
}

Assistant:

int jacobi_symbol ( int q, int p )

//****************************************************************************80
//
//  Purpose:
//
//    JACOBI_SYMBOL evaluates the Jacobi symbol (Q/P).
//
//  Discussion:
//
//    If P is prime, then
//
//      Jacobi Symbol (Q/P) = Legendre Symbol (Q/P)
//
//    Else
//
//      let P have the prime factorization
//
//        P = Product ( 1 <= I <= N ) P(I)^E(I)
//
//      Jacobi Symbol (Q/P) =
//
//        Product ( 1 <= I <= N ) Legendre Symbol (Q/P(I))^E(I)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    30 June 2000
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Daniel Zwillinger,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996, pages 86-87.
//
//  Parameters:
//
//    Input, int Q, an integer whose Jacobi symbol with
//    respect to P is desired.
//
//    Input, int P, the number with respect to which the Jacobi
//    symbol of Q is desired.  P should be 2 or greater.
//
//    Output, int JACOBI_SYMBOL, the Jacobi symbol (Q/P).
//    Ordinarily, L will be -1, 0 or 1.
//    If JACOBI_SYMBOL is -10, an error occurred.
//
{
# define FACTOR_MAX 20

  int factor[FACTOR_MAX];
  int i;
  int l;
  int nfactor;
  int nleft;
  int power[FACTOR_MAX];
  int value;
//
//  P must be greater than 1.
//
  if ( p <= 1 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SYMBOL - Fatal error!\n";
    std::cerr << "  P must be greater than 1.\n";
    exit ( 1 );
  }
//
//  Decompose P into factors of prime powers.
//
  i4_factor ( p, FACTOR_MAX, nfactor, factor, power, nleft );

  if ( nleft != 1 )
  {
    std::cerr << "\n";
    std::cerr << "JACOBI_SYMBOL - Fatal error!\n";
    std::cerr << "  Not enough factorization space.\n";
    exit ( 1 );
  }
//
//  Force Q to be nonnegative.
//
  while ( q < 0 )
  {
    q = q + p;
  }
//
//  For each prime factor, compute the Legendre symbol, and
//  multiply the Jacobi symbol by the appropriate factor.
//
  value = 1;

  for ( i = 0; i < nfactor; i++ )
  {
    l = legendre_symbol ( q, factor[i] );

    if ( l < -1 )
    {
      std::cerr << "\n";
      std::cerr << "JACOBI_SYMBOL - Fatal error!\n";
      std::cerr << "  Error during Legendre symbol calculation.\n";
      exit ( 1 );
    }
    value = value * int(pow ( double(l), power[i] ));
  }

  return value;
# undef FACTOR_MAX
}